

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_colour.c
# Opt level: O2

int main(void)

{
  int o;
  HRESULT HVar1;
  DecklinkDisplayMode displayMode;
  cdecklink_iterator_t_conflict *obj;
  long lVar2;
  long lVar3;
  cdecklink_video_frame_t_conflict *obj_00;
  long lVar4;
  int iVar5;
  int iVar6;
  char *__s;
  uint uVar7;
  cdecklink_display_mode_t *mode;
  int index;
  cdecklink_output_t *output;
  cdecklink_device_t_conflict *local_60;
  uint8_t *bytes;
  cdecklink_display_mode_iterator_t *mode_iterator;
  cdecklink_mutable_video_frame_t *mutable_frame;
  char *name;
  char *display_name;
  
  obj = cdecklink_create_decklink_iterator_instance();
  if (obj == (cdecklink_iterator_t_conflict *)0x0) goto LAB_001023e3;
  index = 3;
  printf("Choose decklink device to output to: ");
  putchar(10);
  __isoc99_scanf("%d",&index);
  iVar5 = -1;
  while( true ) {
    local_60 = (cdecklink_device_t_conflict *)0x0;
    HVar1 = cdecklink_iterator_next(obj,&local_60);
    iVar6 = iVar5;
    if ((HVar1 != 0) || (iVar5 = iVar5 + 1, iVar6 = index, iVar5 == index)) break;
    cdecklink_device_release(local_60);
  }
  if (local_60 == (cdecklink_device_t_conflict *)0x0 || iVar6 != index) {
    __s = "Invalid device index";
  }
  else {
    HVar1 = cdecklink_device_get_display_name(local_60,&display_name);
    if (HVar1 < 0) {
      __s = "Failed to get device name";
    }
    else {
      printf("Selected device: %s\n",display_name);
      cdecklink_free_string(display_name);
      HVar1 = cdecklink_device_query_output(local_60,(cdecklink_output_t_conflict **)&output);
      if (HVar1 < 0) {
        __s = "Device does not support output";
      }
      else {
        HVar1 = cdecklink_output_get_display_mode_iterator
                          ((cdecklink_output_t_conflict *)output,
                           (cdecklink_display_mode_iterator_t_conflict **)&mode_iterator);
        if (HVar1 == 0) {
          puts("Select videomode:");
          uVar7 = 0;
          while (HVar1 = cdecklink_display_mode_iterator_next
                                   ((cdecklink_display_mode_iterator_t_conflict *)mode_iterator,
                                    (cdecklink_display_mode_t_conflict **)&mode), HVar1 == 0) {
            HVar1 = cdecklink_display_mode_get_name((cdecklink_display_mode_t_conflict *)mode,&name)
            ;
            if (-1 < HVar1) {
              printf("%d: %s\n",(ulong)uVar7,name);
              cdecklink_free_string(name);
              cdecklink_display_mode_release((cdecklink_display_mode_t_conflict *)mode);
              mode = (cdecklink_display_mode_t *)0x0;
              uVar7 = uVar7 + 1;
            }
          }
          cdecklink_display_mode_iterator_release
                    ((cdecklink_display_mode_iterator_t_conflict *)mode_iterator);
          mode_iterator = (cdecklink_display_mode_iterator_t *)0x0;
          index = 7;
          putchar(10);
          iVar5 = 0;
          __isoc99_scanf("%d",&index);
          HVar1 = cdecklink_output_get_display_mode_iterator
                            ((cdecklink_output_t_conflict *)output,
                             (cdecklink_display_mode_iterator_t_conflict **)&mode_iterator);
          if (HVar1 == 0) {
            for (; (HVar1 = cdecklink_display_mode_iterator_next
                                      ((cdecklink_display_mode_iterator_t_conflict *)mode_iterator,
                                       (cdecklink_display_mode_t_conflict **)&mode), HVar1 == 0 &&
                   (iVar5 != index)); iVar5 = iVar5 + 1) {
              cdecklink_display_mode_release((cdecklink_display_mode_t_conflict *)mode);
              mode = (cdecklink_display_mode_t *)0x0;
            }
            lVar2 = cdecklink_display_mode_get_width((cdecklink_display_mode_t_conflict *)mode);
            lVar3 = cdecklink_display_mode_get_height((cdecklink_display_mode_t_conflict *)mode);
            HVar1 = cdecklink_output_create_video_frame
                              ((cdecklink_output_t_conflict *)output,(int)lVar2,(int32_t)lVar3,
                               (int)lVar2 * 4,0x42475241,0,
                               (cdecklink_mutable_video_frame_t_conflict **)&mutable_frame);
            if (HVar1 == 0) {
              obj_00 = cdecklink_video_input_frame_to_video_frame
                                 ((cdecklink_video_input_frame_t_conflict *)mutable_frame);
              HVar1 = cdecklink_video_frame_get_bytes(obj_00,&bytes);
              if (HVar1 == 0) {
                for (lVar4 = 0; lVar4 < lVar2 * lVar3 * 4; lVar4 = lVar4 + 4) {
                  bytes[lVar4] = 0xff;
                  bytes[lVar4 + 1] = 'x';
                  bytes[lVar4 + 2] = '\0';
                  bytes[lVar4 + 3] = 0xff;
                }
                displayMode = cdecklink_display_mode_get_display_mode
                                        ((cdecklink_display_mode_t_conflict *)mode);
                HVar1 = cdecklink_output_enable_video_output
                                  ((cdecklink_output_t_conflict *)output,displayMode,0);
                if (HVar1 == 0) {
                  HVar1 = cdecklink_output_display_video_frame_sync
                                    ((cdecklink_output_t_conflict *)output,obj_00);
                  if (HVar1 == 0) {
                    sleep(1);
                    puts("Press Any Key to Continue");
                    __isoc99_scanf("%d",&index);
                    goto LAB_001023e3;
                  }
                  __s = "Failed to schedule frame";
                }
                else {
                  __s = "Failed to enable video output";
                }
              }
              else {
                __s = "Failed to get frame bytes";
              }
            }
            else {
              __s = "Failed to create output frame";
            }
            goto LAB_001023de;
          }
        }
        __s = "Failed to create output mode iterator";
      }
    }
  }
LAB_001023de:
  puts(__s);
LAB_001023e3:
  if (mutable_frame != (cdecklink_mutable_video_frame_t *)0x0) {
    cdecklink_mutable_video_frame_release((cdecklink_mutable_video_frame_t_conflict *)mutable_frame)
    ;
  }
  if (mode_iterator != (cdecklink_display_mode_iterator_t *)0x0) {
    cdecklink_display_mode_iterator_release
              ((cdecklink_display_mode_iterator_t_conflict *)mode_iterator);
  }
  if (output != (cdecklink_output_t *)0x0) {
    cdecklink_output_release((cdecklink_output_t_conflict *)output);
  }
  if (local_60 != (cdecklink_device_t_conflict *)0x0) {
    cdecklink_device_release(local_60);
  }
  if (obj != (cdecklink_iterator_t_conflict *)0x0) {
    cdecklink_iterator_release(obj);
  }
  return 0;
}

Assistant:

int main() {
    cdecklink_iterator_t *iterator = cdecklink_create_decklink_iterator_instance();
    if (!iterator)
        goto CLEANUP;

    int index = 3;
    printf("Choose decklink device to output to: ");
    printf("\n");
    scanf("%d", &index);

    // Fetch the selected device
    cdecklink_device_t *device = NULL;
    int i = -1;
    while (cdecklink_iterator_next(iterator, &device) == S_OK) {
        if (++i == index) {
            break;
        }

        cdecklink_device_release(device);
        device = NULL;
    }

    if (i != index || device == NULL) {
        printf("Invalid device index\n");
        goto CLEANUP;
    }

    const char *display_name;
    if (FAILED(cdecklink_device_get_display_name(device, &display_name))) {
        printf("Failed to get device name\n");
        goto CLEANUP;
    }
    printf("Selected device: %s\n", display_name);
    cdecklink_free_string(display_name);

    cdecklink_output_t *output;
    if (FAILED(cdecklink_device_query_output(device, &output))) {
        printf("Device does not support output\n");
        goto CLEANUP;
    }

    // List the supported modes
    cdecklink_display_mode_iterator_t *mode_iterator;
    if (cdecklink_output_get_display_mode_iterator(output, &mode_iterator) != S_OK) {
        printf("Failed to create output mode iterator\n");
        goto CLEANUP;
    }

    printf("Select videomode:\n");
    cdecklink_display_mode_t *mode;
    int mode_i = 0;
    while (cdecklink_display_mode_iterator_next(mode_iterator, &mode) == S_OK) {
        const char *name;
        if (FAILED(cdecklink_display_mode_get_name(mode, &name))) {
            // TODO
        } else {
            printf("%d: %s\n", mode_i++, name);
            cdecklink_free_string(name);
            cdecklink_display_mode_release(mode);
            mode = NULL;
        }
    }
    cdecklink_display_mode_iterator_release(mode_iterator);
    mode_iterator = NULL;

    index = 7;
    printf("\n");
    scanf("%d", &index);

    // Fetch the selected mode
    if (cdecklink_output_get_display_mode_iterator(output, &mode_iterator) != S_OK) {
        printf("Failed to create output mode iterator\n");
        goto CLEANUP;
    }
    mode_i = -1;
    while (cdecklink_display_mode_iterator_next(mode_iterator, &mode) == S_OK) {
        if (++mode_i == index) {
            break;
        }
        cdecklink_display_mode_release(mode);
        mode = NULL;
    }

    // Create a frame
    long width = cdecklink_display_mode_get_width(mode);
    long height = cdecklink_display_mode_get_height(mode);
    cdecklink_mutable_video_frame_t *mutable_frame;
    if (cdecklink_output_create_video_frame(output, width, height, width * 4, decklinkFormat8BitBGRA,
                                                   decklinkFrameFlagDefault, &mutable_frame) != S_OK) {
        printf("Failed to create output frame\n");
        goto CLEANUP;
    }
    cdecklink_video_frame_t *frame = cdecklink_video_input_frame_to_video_frame(mutable_frame);

    // Fill the frame
    uint8_t *bytes;
    if (cdecklink_video_frame_get_bytes(frame, (void **) (&bytes)) != S_OK) {
        printf("Failed to get frame bytes\n");
        goto CLEANUP;
    }
    for (int o = 0; o < width * height * 4; o += 4) {
        bytes[o] = 255;
        bytes[o + 1] = 120;
        bytes[o + 2] = 0;
        bytes[o + 3] = 255;
    }

    DecklinkDisplayMode mode2 = cdecklink_display_mode_get_display_mode(mode);
    if (cdecklink_output_enable_video_output(output, mode2, decklinkVideoOutputFlagDefault) != S_OK) {
        printf("Failed to enable video output\n");
        goto CLEANUP;
    }

    // Schedule frame
    if (cdecklink_output_display_video_frame_sync(output, frame) != S_OK) {
        printf("Failed to schedule frame\n");
        goto CLEANUP;
    }

    // Wait for termination
    sleep(1);
    printf("Press Any Key to Continue\n");
    scanf("%d", &index);

    CLEANUP:

    if (mutable_frame)
        cdecklink_mutable_video_frame_release(mutable_frame);

    if (mode_iterator)
        cdecklink_display_mode_iterator_release(mode_iterator);

    if (output)
        cdecklink_output_release(output);

    if (device)
        cdecklink_device_release(device);

    if (iterator)
        cdecklink_iterator_release(iterator);

    return 0;
}